

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::AddPaperdollData(Character *this,PacketBuilder *builder,char *format)

{
  EIF *pEVar1;
  uint *puVar2;
  EIF_Data *pEVar3;
  EIF_Data *pEVar4;
  reference pvVar5;
  char *local_40;
  char *p;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  unsigned_short shield;
  unsigned_short weapon;
  unsigned_short hat;
  unsigned_short armor;
  unsigned_short boots;
  EIF_Data *wep;
  char *format_local;
  PacketBuilder *builder_local;
  Character *this_local;
  
  pEVar1 = this->world->eif;
  puVar2 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,8);
  pEVar3 = EIF::Get(pEVar1,*puVar2);
  pEVar1 = this->world->eif;
  puVar2 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,0);
  pEVar4 = EIF::Get(pEVar1,*puVar2);
  shield = (unsigned_short)(pEVar4->field_25).scrollmap;
  pEVar1 = this->world->eif;
  puVar2 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,4);
  pEVar4 = EIF::Get(pEVar1,*puVar2);
  local_2c = (ushort)(pEVar4->field_25).scrollmap;
  pEVar1 = this->world->eif;
  puVar2 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,6);
  pEVar4 = EIF::Get(pEVar1,*puVar2);
  local_2e = (ushort)(pEVar4->field_25).scrollmap;
  local_30 = (ushort)(pEVar3->field_25).scrollmap;
  pEVar1 = this->world->eif;
  puVar2 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,7);
  pEVar4 = EIF::Get(pEVar1,*puVar2);
  p._6_2_ = (ushort)(pEVar4->field_25).scrollmap;
  if ((pEVar3->subtype == TwoHanded) && ((pEVar3->field_27).scrolly != '\0')) {
    p._6_2_ = (ushort)(pEVar3->field_27).scrolly;
  }
  pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,0);
  if (*pvVar5 != 0) {
    pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,0);
    shield = (unsigned_short)*pvVar5;
  }
  pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,4);
  if (*pvVar5 != 0) {
    pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,4);
    local_2c = (ushort)*pvVar5;
  }
  pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,6);
  if (*pvVar5 != 0) {
    pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,6);
    local_2e = (ushort)*pvVar5;
  }
  pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,8);
  if (*pvVar5 != 0) {
    pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,8);
    local_30 = (ushort)*pvVar5;
  }
  pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,7);
  if (*pvVar5 != 0) {
    pvVar5 = std::array<int,_15UL>::operator[](&this->cosmetic_paperdoll,7);
    p._6_2_ = (ushort)*pvVar5;
  }
  if (shield == 0xffff) {
    shield = 0;
  }
  if (local_2c == 0xffff) {
    local_2c = 0;
  }
  if (local_2e == 0xffff) {
    local_2e = 0;
  }
  if (local_30 == 0xffff) {
    local_30 = 0;
  }
  local_40 = format;
  if (p._6_2_ == 0xffff) {
    p._6_2_ = 0;
  }
  for (; *local_40 != '\0'; local_40 = local_40 + 1) {
    switch(*local_40) {
    case '0':
      PacketBuilder::AddShort(builder,0);
      break;
    case 'A':
      PacketBuilder::AddShort(builder,(uint)local_2c);
      break;
    case 'B':
      PacketBuilder::AddShort(builder,(uint)shield);
      break;
    case 'H':
      PacketBuilder::AddShort(builder,(uint)local_2e);
      break;
    case 'S':
      PacketBuilder::AddShort(builder,(uint)p._6_2_);
      break;
    case 'W':
      PacketBuilder::AddShort(builder,(uint)local_30);
    }
  }
  return;
}

Assistant:

void Character::AddPaperdollData(PacketBuilder& builder, const char* format)
{
	const EIF_Data& wep = this->world->eif->Get(this->paperdoll[Character::Weapon]);

	unsigned short boots = this->world->eif->Get(this->paperdoll[Character::Boots]).dollgraphic;
	unsigned short armor = this->world->eif->Get(this->paperdoll[Character::Armor]).dollgraphic;
	unsigned short hat = this->world->eif->Get(this->paperdoll[Character::Hat]).dollgraphic;
	unsigned short weapon = wep.dollgraphic;
	unsigned short shield = this->world->eif->Get(this->paperdoll[Character::Shield]).dollgraphic;

	if (wep.subtype == EIF::TwoHanded && wep.dual_wield_dollgraphic)
		shield = wep.dual_wield_dollgraphic;

	if (this->cosmetic_paperdoll[Character::Boots])  boots = this->cosmetic_paperdoll[Character::Boots];
	if (this->cosmetic_paperdoll[Character::Armor])  armor = this->cosmetic_paperdoll[Character::Armor];
	if (this->cosmetic_paperdoll[Character::Hat])    hat = this->cosmetic_paperdoll[Character::Hat];
	if (this->cosmetic_paperdoll[Character::Weapon]) weapon = this->cosmetic_paperdoll[Character::Weapon];
	if (this->cosmetic_paperdoll[Character::Shield]) shield = this->cosmetic_paperdoll[Character::Shield];

	if (boots == 65535)  boots = 0;
	if (armor == 65535)  armor = 0;
	if (hat == 65535)    hat = 0;
	if (weapon == 65535) weapon = 0;
	if (shield == 65535) shield = 0;

	for (const char* p = format; *p != '\0'; ++p)
	{
		switch (*p)
		{
			case 'B': builder.AddShort(boots); break;
			case 'A': builder.AddShort(armor); break;
			case 'H': builder.AddShort(hat); break;
			case 'W': builder.AddShort(weapon); break;
			case 'S': builder.AddShort(shield); break;
			case '0': builder.AddShort(0); break;
		}
	}
}